

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O0

void __thiscall
MemoryFile_ReadFileWithInitialContents_Test::TestBody
          (MemoryFile_ReadFileWithInitialContents_Test *this)

{
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *in_R9;
  AssertHelper local_1f0;
  Message local_1e8;
  uint64_t local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_1a8;
  Message local_1a0;
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_;
  Message local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_3;
  size_t local_158;
  size_t actual_read;
  buffer out;
  Message local_138;
  uint64_t local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_2;
  Message local_110;
  uint64_t local_108;
  uint local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  string local_e0;
  MemoryFile local_c0;
  shared_ptr<void> local_b0;
  undefined1 local_a0 [8];
  in_memory mf;
  AssertHelper local_60;
  Message local_58 [3];
  unsigned_long local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  char source_string [12];
  size_t elements;
  MemoryFile_ReadFileWithInitialContents_Test *this_local;
  
  stack0xffffffffffffffe8 = 0xb;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x6f57206f6c6c6548;
  source_string[0] = 'r';
  source_string[1] = 'l';
  source_string[2] = 'd';
  source_string[3] = '\0';
  local_40 = 0xb;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_38,"elements","std::strlen (source_string)",
             (unsigned_long *)(source_string + 8),&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pMVar2 = testing::Message::operator<<(local_58,(char (*) [30])"Expected buffer length to be ");
    pMVar2 = testing::Message::operator<<(pMVar2,(unsigned_long *)(source_string + 8));
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
               ,0x1ba,pcVar3);
    testing::internal::AssertHelper::operator=(&local_60,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  mf.pos_._5_3_ = 0;
  mf.pos_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (mf.pos_._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e0,(char *)&gtest_ar.message_,
               (allocator *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    anon_unknown.dwarf_16883::MemoryFile::make_buffer(&local_c0,&local_e0);
    std::shared_ptr<void>::shared_ptr<unsigned_char,void>
              (&local_b0,(shared_ptr<unsigned_char> *)&local_c0);
    pstore::file::in_memory::in_memory((in_memory *)local_a0,&local_b0,0xb,0xb,true);
    std::shared_ptr<void>::~shared_ptr(&local_b0);
    std::shared_ptr<unsigned_char>::~shared_ptr((shared_ptr<unsigned_char> *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7));
    local_fc = 0;
    local_108 = pstore::file::in_memory::tell((in_memory *)local_a0);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              ((EqHelper *)local_f8,"0U","mf.tell ()",&local_fc,&local_108);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pMVar2 = testing::Message::operator<<
                         (&local_110,(char (*) [41])"Expected the initial file offset to be 0");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                 ,0x1be,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
    local_130 = pstore::file::in_memory::size((in_memory *)local_a0);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_128,"elements","mf.size ()",(unsigned_long *)(source_string + 8),
               &local_130);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      pMVar2 = testing::Message::operator<<
                         (&local_138,
                          (char (*) [52])"Expected the file to be the same size as the string");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                 ,0x1bf,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 pMVar2);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &out.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      testing::Message::~Message(&local_138);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
    anon_unknown.dwarf_16883::MemoryFile::make_buffer((MemoryFile *)&actual_read,0xb);
    peVar4 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)&actual_read);
    pstore::gsl::not_null<void_*>::not_null((not_null<void_*> *)&gtest_ar_3.message_,peVar4);
    local_158 = pstore::file::in_memory::read_buffer
                          ((in_memory *)local_a0,
                           (not_null<void_*>)
                           gtest_ar_3.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl,0xb);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_170,"elements","actual_read",(unsigned_long *)(source_string + 8),
               &local_158);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_178);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                 ,0x1c3,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_178);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_178);
    }
    mf.pos_._5_3_ = 0;
    mf.pos_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
    if (mf.pos_._4_4_ == 0) {
      peVar4 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)&actual_read);
      peVar5 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)&actual_read);
      local_191 = std::equal<unsigned_char*,char_const*>
                            (peVar4,peVar5 + 0xb,(char *)&gtest_ar.message_);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_190,&local_191,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
      if (!bVar1) {
        testing::Message::Message(&local_1a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_4.message_,(internal *)local_190,
                   (AssertionResult *)
                   "std::equal (out.get (), out.get () + elements, source_string)","false","true",
                   in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                   ,0x1c4,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_1a0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
      local_1e0 = pstore::file::in_memory::tell((in_memory *)local_a0);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                ((EqHelper *)local_1d8,"elements","mf.tell ()",(unsigned_long *)(source_string + 8),
                 &local_1e0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
      if (!bVar1) {
        testing::Message::Message(&local_1e8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file.cpp"
                   ,0x1c5,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
        testing::internal::AssertHelper::~AssertHelper(&local_1f0);
        testing::Message::~Message(&local_1e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
      mf.pos_._4_4_ = 0;
    }
    std::shared_ptr<unsigned_char>::~shared_ptr((shared_ptr<unsigned_char> *)&actual_read);
    pstore::file::in_memory::~in_memory((in_memory *)local_a0);
  }
  return;
}

Assistant:

TEST_F (MemoryFile, ReadFileWithInitialContents) {
    constexpr std::size_t elements = 11;
    char const source_string[elements + 1]{"Hello World"};
    ASSERT_EQ (elements, std::strlen (source_string))
        << "Expected buffer length to be " << elements;
    pstore::file::in_memory mf (MemoryFile::make_buffer (source_string), elements, elements);

    EXPECT_EQ (0U, mf.tell ()) << "Expected the initial file offset to be 0";
    EXPECT_EQ (elements, mf.size ()) << "Expected the file to be the same size as the string";

    auto out = MemoryFile::make_buffer (elements);
    std::size_t const actual_read = mf.read_buffer (out.get (), elements);
    ASSERT_EQ (elements, actual_read);
    EXPECT_TRUE (std::equal (out.get (), out.get () + elements, source_string));
    EXPECT_EQ (elements, mf.tell ());
}